

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# playerdisplay.cpp
# Opt level: O3

void __thiscall FListMenuItemPlayerDisplay::UpdateRandomClass(FListMenuItemPlayerDisplay *this)

{
  BYTE *pBVar1;
  FPlayerClass *pFVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  FState *pFVar6;
  
  iVar5 = this->mRandomTimer;
  this->mRandomTimer = iVar5 + -1;
  if (0 < iVar5) {
    return;
  }
  iVar3 = this->mRandomClass + 1;
  iVar5 = 0;
  if (iVar3 < (int)PlayerClasses.Count) {
    iVar5 = iVar3;
  }
  this->mRandomClass = iVar5;
  pFVar2 = PlayerClasses.Array;
  this->mPlayerClass = PlayerClasses.Array + iVar5;
  pBVar1 = ((pFVar2[iVar5].Type)->super_PClassActor).super_PClass.Defaults;
  pFVar6 = *(FState **)(pBVar1 + 0x410);
  this->mPlayerState = pFVar6;
  if (pFVar6 == (FState *)0x0) {
    pFVar6 = *(FState **)(pBVar1 + 0x408);
    this->mPlayerState = pFVar6;
    if (pFVar6 == (FState *)0x0) {
      iVar5 = -1;
      goto LAB_0034009e;
    }
  }
  iVar5 = (int)pFVar6->Tics;
  if (pFVar6->TicRange != 0) {
    uVar4 = FRandom::GenRand32(&FState::pr_statetics);
    iVar5 = iVar5 + uVar4 % (pFVar6->TicRange + 1);
  }
LAB_0034009e:
  this->mPlayerTics = iVar5;
  this->mRandomTimer = 6;
  UpdateTranslation(this);
  return;
}

Assistant:

void FListMenuItemPlayerDisplay::UpdateRandomClass()
{
	if (--mRandomTimer < 0)
	{
		if (++mRandomClass >= (int)PlayerClasses.Size ()) mRandomClass = 0;
		mPlayerClass = &PlayerClasses[mRandomClass];
		mPlayerState = GetDefaultByType (mPlayerClass->Type)->SeeState;
		if (mPlayerState == NULL)
		{ // No see state, so try spawn state.
			mPlayerState = GetDefaultByType (mPlayerClass->Type)->SpawnState;
		}
		mPlayerTics = mPlayerState != NULL ? mPlayerState->GetTics() : -1;
		mRandomTimer = 6;

		// Since the newly displayed class may used a different translation
		// range than the old one, we need to update the translation, too.
		UpdateTranslation();
	}
}